

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactoredQLastTimeStepOrQMDP.cpp
# Opt level: O1

void __thiscall
FactoredQLastTimeStepOrQMDP::FactoredQLastTimeStepOrQMDP
          (FactoredQLastTimeStepOrQMDP *this,PlanningUnitFactoredDecPOMDPDiscrete *puf)

{
  QMDP *this_00;
  
  *(undefined8 *)&(this->super_FactoredQLastTimeStepOrElse).super_QFunctionForFactoredDecPOMDP =
       0x5a3248;
  (this->super_FactoredQLastTimeStepOrElse).super_FactoredQFunctionStateJAOHInterface.
  super_QFunctionJAOHInterface = (QFunctionJAOHInterface)0x5a3340;
  FactoredQLastTimeStepOrElse::FactoredQLastTimeStepOrElse
            (&this->super_FactoredQLastTimeStepOrElse,&PTR_construction_vtable_136__005a29a8,puf);
  (this->super_FactoredQLastTimeStepOrElse).super_FactoredQFunctionStateJAOHInterface.
  super_QFunctionJAOHInterface = (QFunctionJAOHInterface)0x5a27d8;
  *(undefined8 *)&(this->super_FactoredQLastTimeStepOrElse).super_QFunctionForFactoredDecPOMDP =
       0x5a2920;
  this_00 = (QMDP *)operator_new(0x70);
  QMDP::QMDP(this_00,&puf->super_PlanningUnitDecPOMDPDiscrete,false);
  this->_m_QMDP = this_00;
  return;
}

Assistant:

FactoredQLastTimeStepOrQMDP::
FactoredQLastTimeStepOrQMDP(const PlanningUnitFactoredDecPOMDPDiscrete* puf) :
    FactoredQLastTimeStepOrElse(puf)
{
    _m_QMDP=new QMDP( puf );
}